

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
::lower_bound<phmap::priv::(anonymous_namespace)::StringLike>
          (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
           *this,StringLike *key)

{
  bool bVar1;
  SearchResult<int,_false> SVar2;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  *this_00;
  key_compare *in_RDX;
  undefined8 extraout_RDX;
  key_compare *extraout_RDX_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>,_phmap::priv::(anonymous_namespace)::StringLike_&,_phmap::priv::(anonymous_namespace)::StringLike_*>
  bVar3;
  iterator iVar4;
  
  this_00 = (this->root_).
            super__Tuple_impl<0UL,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>_*>
            .
            super__Tuple_impl<1UL,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>_*>
            .
            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>_*>
            .
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>_*,_false>
            ._M_head_impl;
  while( true ) {
    SVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
            ::lower_bound<phmap::priv::(anonymous_namespace)::StringLike>(this_00,key,in_RDX);
    bVar1 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
            ::leaf(this_00);
    if (bVar1) break;
    this_00 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
              ::child(this_00,(long)SVar2.value);
    in_RDX = extraout_RDX_00;
  }
  bVar3.node = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                *)(ulong)(uint)SVar2.value;
  bVar3._8_8_ = extraout_RDX;
  bVar3 = btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>
          ::
          internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>,phmap::priv::(anonymous_namespace)::StringLike&,phmap::priv::(anonymous_namespace)::StringLike*>>
                    ((btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>
                      *)this_00,bVar3);
  iVar4 = internal_end(this,bVar3);
  return iVar4;
}

Assistant:

iterator lower_bound(const K &key) {
            return internal_end(internal_lower_bound(key));
        }